

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O3

Vec_Int_t * Pdr_ManCubeToLits(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,int fCompl,int fNext)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p->vLits->nSize = 0;
  if (fCompl != 0 && fNext != 0) {
    __assert_fail("!(fNext && fCompl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrSat.c"
                  ,0x94,"Vec_Int_t *Pdr_ManCubeToLits(Pdr_Man_t *, int, Pdr_Set_t *, int, int)");
  }
  iVar2 = pCube->nLits;
  if (0 < iVar2) {
    lVar7 = 0;
    do {
      uVar4 = *(uint *)(&pCube->field_0x14 + lVar7 * 4);
      if (uVar4 != 0xffffffff) {
        pAVar1 = p->pAig;
        if (fNext == 0) {
          uVar4 = ((int)uVar4 >> 1) + pAVar1->nTruePis;
          if (((int)uVar4 < 0) || (pAVar1->vCis->nSize <= (int)uVar4)) goto LAB_00556968;
          ppvVar5 = pAVar1->vCis->pArray + uVar4;
          iVar2 = 3;
        }
        else {
          uVar3 = ((int)uVar4 >> 1) + pAVar1->nTruePos;
          if (((int)uVar3 < 0) || (pAVar1->vCos->nSize <= (int)uVar3)) {
LAB_00556968:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar5 = pAVar1->vCos->pArray + uVar3;
          iVar2 = 2 - (uVar4 & 1);
        }
        iVar2 = Pdr_ObjSatVar(p,k,iVar2,(Aig_Obj_t *)*ppvVar5);
        if (iVar2 < 0) {
          __assert_fail("iVar >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrSat.c"
                        ,0x9d,
                        "Vec_Int_t *Pdr_ManCubeToLits(Pdr_Man_t *, int, Pdr_Set_t *, int, int)");
        }
        Vec_IntPush(p->vLits,(uint)((*(uint *)(&pCube->field_0x14 + lVar7 * 4) & 1) != fCompl) +
                             iVar2 * 2);
        iVar2 = pCube->nLits;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar2);
  }
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->tCnf = p->tCnf + lVar7 + lVar6;
  return p->vLits;
}

Assistant:

Vec_Int_t * Pdr_ManCubeToLits( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, int fCompl, int fNext )
{
    Aig_Obj_t * pObj;
    int i, iVar, iVarMax = 0;
    abctime clk = Abc_Clock();
    Vec_IntClear( p->vLits );
    assert( !(fNext && fCompl) );
    for ( i = 0; i < pCube->nLits; i++ )
    {
        if ( pCube->Lits[i] == -1 )
            continue;
        if ( fNext )
            pObj = Saig_ManLi( p->pAig, lit_var(pCube->Lits[i]) );
        else
            pObj = Saig_ManLo( p->pAig, lit_var(pCube->Lits[i]) );
        iVar = Pdr_ObjSatVar( p, k, fNext ? 2 - lit_sign(pCube->Lits[i]) : 3, pObj ); assert( iVar >= 0 );
        iVarMax = Abc_MaxInt( iVarMax, iVar );
        Vec_IntPush( p->vLits, toLitCond( iVar, fCompl ^ lit_sign(pCube->Lits[i]) ) );
    }
//    sat_solver_setnvars( Pdr_ManSolver(p, k), iVarMax + 1 );
    p->tCnf += Abc_Clock() - clk;
    return p->vLits;
}